

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t MATROSKA_BlockReleaseData(matroska_block *Block,bool_t IncludingNotRead)

{
  int32_t *local_30;
  int32_t *o;
  int32_t *i;
  bool_t IncludingNotRead_local;
  matroska_block *Block_local;
  
  if ((IncludingNotRead != 0) || (Block->GlobalTimestamp != 0x7fffffffffffffff)) {
    ArrayClear(&Block->Data);
    (Block->Base).Base.bValueIsSet = '\0';
    if (Block == (matroska_block *)0xffffffffffffff68) {
      __assert_fail("&(Block->SizeListIn)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x3ad,"err_t MATROSKA_BlockReleaseData(matroska_block *, bool_t)");
    }
    if ((Block->SizeListIn)._Used >> 2 != 0) {
      if (Block == (matroska_block *)0xffffffffffffff68) {
        __assert_fail("&(Block->SizeListIn)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x3b1,"err_t MATROSKA_BlockReleaseData(matroska_block *, bool_t)");
      }
      if (Block == (matroska_block *)0xffffffffffffff78) {
        __assert_fail("&(Block->SizeList)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x3b1,"err_t MATROSKA_BlockReleaseData(matroska_block *, bool_t)");
      }
      if ((Block->SizeListIn)._Used >> 2 != (Block->SizeList)._Used >> 2) {
        __assert_fail("ARRAYCOUNT(Block->SizeListIn,int32_t) == ARRAYCOUNT(Block->SizeList,int32_t)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x3b1,"err_t MATROSKA_BlockReleaseData(matroska_block *, bool_t)");
      }
      if (Block == (matroska_block *)0xffffffffffffff68) {
        __assert_fail("&(Block->SizeListIn)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x3b2,"err_t MATROSKA_BlockReleaseData(matroska_block *, bool_t)");
      }
      o = (int32_t *)(Block->SizeListIn)._Begin;
      if (Block == (matroska_block *)0xffffffffffffff78) {
        __assert_fail("&(Block->SizeList)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x3b2,"err_t MATROSKA_BlockReleaseData(matroska_block *, bool_t)");
      }
      local_30 = (int32_t *)(Block->SizeList)._Begin;
      while( true ) {
        if (Block == (matroska_block *)0xffffffffffffff68) {
          __assert_fail("&(Block->SizeListIn)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x3b2,"err_t MATROSKA_BlockReleaseData(matroska_block *, bool_t)");
        }
        if (o == (int32_t *)
                 ((Block->SizeListIn)._Begin + ((Block->SizeListIn)._Used & 0xfffffffffffffffc)))
        break;
        *local_30 = *o;
        o = o + 1;
        local_30 = local_30 + 1;
      }
      ArrayClear(&Block->SizeListIn);
    }
  }
  return 0;
}

Assistant:

err_t MATROSKA_BlockReleaseData(matroska_block *Block, bool_t IncludingNotRead)
{
    if (!IncludingNotRead && Block->GlobalTimestamp==INVALID_TIMESTAMP_T)
        return ERR_NONE;
    ArrayClear(&Block->Data);
    Block->Base.Base.bValueIsSet = 0;
    if (ARRAYCOUNT(Block->SizeListIn,int32_t))
    {
        // recover the size of each lace in SizeList for later reading
        int32_t *i,*o;
        assert(ARRAYCOUNT(Block->SizeListIn,int32_t) == ARRAYCOUNT(Block->SizeList,int32_t));
        for (i=ARRAYBEGIN(Block->SizeListIn,int32_t),o=ARRAYBEGIN(Block->SizeList,int32_t);i!=ARRAYEND(Block->SizeListIn,int32_t);++i,++o)
            *o = *i;
        ArrayClear(&Block->SizeListIn);
    }
    return ERR_NONE;
}